

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableEnumOneofFieldLiteGenerator::GenerateParsingCode
          (ImmutableEnumOneofFieldLiteGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  char *text;
  
  variables = &(this->super_ImmutableEnumFieldLiteGenerator).variables_;
  if (*(int *)(*(long *)((this->super_ImmutableEnumFieldLiteGenerator).descriptor_ + 0x30) + 0x8c)
      == 3) {
    text = 
    "int rawValue = input.readEnum();\n$set_oneof_case_message$;\n$oneof_name$_ = rawValue;\n";
  }
  else {
    io::Printer::Print(printer,variables,
                       "int rawValue = input.readEnum();\n$type$ value = $type$.forNumber(rawValue);\nif (value == null) {\n"
                      );
    text = "} else {\n  $set_oneof_case_message$;\n  $oneof_name$_ = rawValue;\n}\n";
    if (*(int *)(*(long *)(*(long *)((this->super_ImmutableEnumFieldLiteGenerator).descriptor_ +
                                    0x58) + 0x10) + 0x8c) != 3) {
      io::Printer::Print(printer,variables,"  super.mergeVarintField($number$, rawValue);\n");
    }
  }
  io::Printer::Print(printer,variables,text);
  return;
}

Assistant:

void ImmutableEnumOneofFieldLiteGenerator::
GenerateParsingCode(io::Printer* printer) const {
  if (SupportUnknownEnumValue(descriptor_->file())) {
    printer->Print(variables_,
      "int rawValue = input.readEnum();\n"
      "$set_oneof_case_message$;\n"
      "$oneof_name$_ = rawValue;\n");
  } else {
    printer->Print(variables_,
      "int rawValue = input.readEnum();\n"
      "$type$ value = $type$.forNumber(rawValue);\n"
      "if (value == null) {\n");
    if (PreserveUnknownFields(descriptor_->containing_type())) {
      printer->Print(variables_,
        "  super.mergeVarintField($number$, rawValue);\n");
    }
    printer->Print(variables_,
      "} else {\n"
      "  $set_oneof_case_message$;\n"
      "  $oneof_name$_ = rawValue;\n"
      "}\n");
  }
}